

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O3

PmError alsa_write_byte(PmInternal *midi,uchar byte,PmTimestamp timestamp)

{
  void *pvVar1;
  int iVar2;
  PmError PVar3;
  undefined7 in_register_00000031;
  
  pvVar1 = midi->descriptor;
  iVar2 = snd_midi_event_encode_byte
                    (*(undefined8 *)((long)pvVar1 + 0x10),CONCAT71(in_register_00000031,byte));
  PVar3 = pmNoData;
  if (iVar2 == 1) {
    if (0 < midi->latency) {
      if (midi->time_proc == (PmTimeProcPtr)0x0) {
        Pt_Time();
      }
      else {
        (*midi->time_proc)(midi->time_info);
      }
    }
    iVar2 = snd_seq_event_output(seq);
    PVar3 = pmNoData;
    if (iVar2 < 0) {
      *(int *)((long)pvVar1 + 0x18) = iVar2;
      PVar3 = pmHostError;
    }
  }
  return PVar3;
}

Assistant:

static PmError alsa_write_byte(PmInternal *midi, unsigned char byte, 
                        PmTimestamp timestamp)
{
    alsa_descriptor_type desc = (alsa_descriptor_type) midi->descriptor;
    snd_seq_event_t ev;
    int err;

    snd_seq_ev_clear(&ev);
    if (snd_midi_event_encode_byte(desc->parser, byte, &ev) == 1) {
        snd_seq_ev_set_dest(&ev, desc->client, desc->port);
        snd_seq_ev_set_source(&ev, desc->this_port);
        if (midi->latency > 0) {
            /* compute relative time of event = timestamp - now + latency */
            PmTimestamp now = (midi->time_proc ? 
                               midi->time_proc(midi->time_info) : 
                               Pt_Time(NULL));
            int when = timestamp;
            /* if timestamp is zero, send immediately */
            /* otherwise compute time delay and use delay if positive */
            if (when == 0) when = now;
            when = (when - now) + midi->latency;
            if (when < 0) when = 0;
            VERBOSE printf("timestamp %d now %d latency %d, ", 
                           (int) timestamp, (int) now, midi->latency);
            VERBOSE printf("scheduling event after %d\n", when);
            /* message is sent in relative ticks, where 1 tick = 1 ms */
            snd_seq_ev_schedule_tick(&ev, queue, 1, when);
            /* NOTE: for cases where the user does not supply a time function,
               we could optimize the code by not starting Pt_Time and using
               the alsa tick time instead. I didn't do this because it would
               entail changing the queue management to start the queue tick
               count when PortMidi is initialized and keep it running until
               PortMidi is terminated. (This should be simple, but it's not
               how the code works now.) -RBD */
        } else { /* send event out without queueing */
            VERBOSE printf("direct\n");
            /* ev.queue = SND_SEQ_QUEUE_DIRECT;
               ev.dest.client = SND_SEQ_ADDRESS_SUBSCRIBERS; */
            snd_seq_ev_set_direct(&ev);
        }
        VERBOSE printf("sending event\n");
        err = snd_seq_event_output(seq, &ev);
        if (err < 0) {
            desc->error = err;
            return pmHostError;
        }
    }
    return pmNoError;
}